

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

int CMU462::Collada::ColladaParser::load(char *filename,SceneInfo *sceneInfo)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  XMLElement *pXVar4;
  char *__s;
  double *pdVar5;
  allocator<char> local_669;
  string local_668;
  XMLElement *local_648;
  XMLElement *e_node;
  string local_638;
  XMLElement *local_618;
  XMLElement *e_scene;
  double local_608;
  double local_600;
  Vector3D local_5f8;
  Vector3D local_5e0 [6];
  undefined8 uStack_550;
  allocator<char> local_541;
  undefined1 local_540 [8];
  string up_dir;
  string local_518;
  XMLElement *local_4f8;
  XMLElement *up_axis;
  string local_4e8;
  XMLElement *local_4c8;
  XMLElement *e_asset;
  XMLElement *root;
  XMLDocument doc;
  undefined1 local_228 [8];
  ifstream in;
  SceneInfo *sceneInfo_local;
  char *filename_local;
  
  std::ifstream::ifstream(local_228,filename,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Warning: could not open file ");
    poVar3 = std::operator<<(poVar3,filename);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    filename_local._4_4_ = -1;
    doc._commentPool._maxAllocs = 1;
  }
  else {
    std::ifstream::close();
    tinyxml2::XMLDocument::XMLDocument((XMLDocument *)&root,true,PRESERVE_WHITESPACE);
    tinyxml2::XMLDocument::LoadFile((XMLDocument *)&root,filename);
    bVar2 = tinyxml2::XMLDocument::Error((XMLDocument *)&root);
    if (bVar2) {
      tinyxml2::XMLDocument::PrintError((XMLDocument *)&root);
      exit(1);
    }
    e_asset = tinyxml2::XMLNode::FirstChildElement((XMLNode *)&root,"COLLADA");
    if (e_asset == (XMLElement *)0x0) {
      exit(1);
    }
    scene = sceneInfo;
    uri_load(e_asset);
    pXVar4 = e_asset;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e8,"asset",(allocator<char> *)((long)&up_axis + 7));
    pXVar4 = get_element(pXVar4,&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&up_axis + 7));
    local_4c8 = pXVar4;
    if (pXVar4 != (XMLElement *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_518,"up_axis",
                 (allocator<char> *)(up_dir.field_2._M_local_buf + 0xf));
      pXVar4 = get_element(pXVar4,&local_518);
      std::__cxx11::string::~string((string *)&local_518);
      std::allocator<char>::~allocator((allocator<char> *)(up_dir.field_2._M_local_buf + 0xf));
      local_4f8 = pXVar4;
      if (pXVar4 == (XMLElement *)0x0) {
        exit(1);
      }
      __s = tinyxml2::XMLElement::GetText(pXVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_540,__s,&local_541);
      std::allocator<char>::~allocator(&local_541);
      Matrix4x4::identity();
      transform._112_8_ = local_5e0[5].z;
      transform._120_8_ = uStack_550;
      transform._96_8_ = local_5e0[5].x;
      transform._104_8_ = local_5e0[5].y;
      transform._80_8_ = local_5e0[4].y;
      transform._88_8_ = local_5e0[4].z;
      transform._64_8_ = local_5e0[3].z;
      transform._72_8_ = local_5e0[4].x;
      transform._48_8_ = local_5e0[3].x;
      transform._56_8_ = local_5e0[3].y;
      transform._32_8_ = local_5e0[2].y;
      transform._40_8_ = local_5e0[2].z;
      transform._16_8_ = local_5e0[1].z;
      transform._24_8_ = local_5e0[2].x;
      transform._0_8_ = local_5e0[1].x;
      transform._8_8_ = local_5e0[1].y;
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_540,"X_UP");
      if (bVar2) {
        pdVar5 = Matrix4x4::operator()((Matrix4x4 *)transform,0,0);
        *pdVar5 = 0.0;
        pdVar5 = Matrix4x4::operator()((Matrix4x4 *)transform,0,1);
        *pdVar5 = 1.0;
        pdVar5 = Matrix4x4::operator()((Matrix4x4 *)transform,1,0);
        *pdVar5 = 1.0;
        pdVar5 = Matrix4x4::operator()((Matrix4x4 *)transform,1,1);
        *pdVar5 = 0.0;
        pdVar5 = Matrix4x4::operator()((Matrix4x4 *)transform,2,2);
        *pdVar5 = -1.0;
        Vector3D::Vector3D(local_5e0,1.0,0.0,0.0);
        up._0_8_ = local_5e0[0].x;
        up._8_8_ = local_5e0[0].y;
        up._16_8_ = local_5e0[0].z;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_540,"Z_UP");
        if (bVar2) {
          pdVar5 = Matrix4x4::operator()((Matrix4x4 *)transform,1,1);
          *pdVar5 = 0.0;
          pdVar5 = Matrix4x4::operator()((Matrix4x4 *)transform,1,2);
          *pdVar5 = 1.0;
          pdVar5 = Matrix4x4::operator()((Matrix4x4 *)transform,2,1);
          *pdVar5 = 1.0;
          pdVar5 = Matrix4x4::operator()((Matrix4x4 *)transform,2,2);
          *pdVar5 = 0.0;
          pdVar5 = Matrix4x4::operator()((Matrix4x4 *)transform,0,0);
          *pdVar5 = -1.0;
          Vector3D::Vector3D(&local_5f8,0.0,0.0,1.0);
          up._0_8_ = local_5f8.x;
          up._8_8_ = local_5f8.y;
          up._16_8_ = local_5f8.z;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_540,"Y_UP");
          if (!bVar2) {
            exit(1);
          }
          Vector3D::Vector3D((Vector3D *)&e_scene,0.0,1.0,0.0);
          up._0_8_ = e_scene;
          up._8_8_ = local_608;
          up._16_8_ = local_600;
        }
      }
      std::__cxx11::string::~string((string *)local_540);
    }
    pXVar4 = e_asset;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_638,"scene/instance_visual_scene",
               (allocator<char> *)((long)&e_node + 7));
    pXVar4 = get_element(pXVar4,&local_638);
    std::__cxx11::string::~string((string *)&local_638);
    std::allocator<char>::~allocator((allocator<char> *)((long)&e_node + 7));
    local_618 = pXVar4;
    if (pXVar4 == (XMLElement *)0x0) {
      filename_local._4_4_ = -1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"node",&local_669);
      pXVar4 = get_element(pXVar4,&local_668);
      std::__cxx11::string::~string((string *)&local_668);
      std::allocator<char>::~allocator(&local_669);
      for (local_648 = pXVar4; local_648 != (XMLElement *)0x0;
          local_648 = tinyxml2::XMLNode::NextSiblingElement(&local_648->super_XMLNode,"node")) {
        parse_node(local_648);
      }
      filename_local._4_4_ = 0;
    }
    doc._commentPool._maxAllocs = 1;
    tinyxml2::XMLDocument::~XMLDocument((XMLDocument *)&root);
  }
  std::ifstream::~ifstream(local_228);
  return filename_local._4_4_;
}

Assistant:

int ColladaParser::load( const char* filename, SceneInfo* sceneInfo )
{
   ifstream in( filename );
   if (!in.is_open())
   {
      cerr << "Warning: could not open file " << filename << endl;
      return -1;
   } in.close();

   XMLDocument doc;
   doc.LoadFile(filename);
   if (doc.Error()) {
      stat("XML error: ");
      doc.PrintError();
      exit(EXIT_FAILURE);
   }

   // Check XML schema
   XMLElement* root = doc.FirstChildElement("COLLADA");
   if (!root) {
      stat("Error: not a COLLADA file!")
         exit(EXIT_FAILURE);
   } else {
      stat("Loading COLLADA file...");
   }

   // Set output scene pointer
   scene = sceneInfo;

   // Build uri table
   uri_load(root);

   // Load assets - correct up direction
   if (XMLElement* e_asset = get_element(root, "asset")) {
      XMLElement* up_axis = get_element(e_asset, "up_axis");
      if (!up_axis) {
         stat("Error: No up direction defined in COLLADA file");
         exit(EXIT_FAILURE);
      }

      // get up direction and correct non-Y_UP scenes by setting a non-identity
      // global entry transformation, assuming right hand coordinate system for
      // both input and output

      string up_dir = up_axis->GetText();
      transform = Matrix4x4::identity();
      if (up_dir == "X_UP") {

         // swap X-Y and negate Z
         transform(0,0) =  0; transform(0,1) = 1;
         transform(1,0) =  1; transform(1,1) = 0;
         transform(2,2) = -1;

         // local up direction for lights and cameras
         up = Vector3D(1,0,0);

      } else if (up_dir == "Z_UP") {

         // swap Z-Y matrix and negate X
         transform(1,1) =  0; transform(1,2) = 1;
         transform(2,1) =  1; transform(2,2) = 0;
         transform(0,0) = -1;

         // local up direction cameras
         up = Vector3D(0,0,1);

      } else if (up_dir == "Y_UP") {
         up = Vector3D(0,1,0); // no need to correct Y_UP as its used internally
      } else {
         stat("Error: invalid up direction in COLLADA file");
         exit(EXIT_FAILURE);
      }
   }

   // Load scene -
   // A scene should only have one visual_scene instance, this constraint
   // creates a one-to-one relationship between the document, the top-level
   // scene, and its visual description (COLLADA spec 1.4 page 91)
   if (XMLElement* e_scene = get_element(root, "scene/instance_visual_scene")) {

      stat("Loading scene...");

      // parse all nodes in scene
      XMLElement* e_node = get_element(e_scene, "node");
      while (e_node) {
         parse_node(e_node);
         e_node = e_node->NextSiblingElement("node");
      }

   } else {
      stat("Error: No scene description found in file:" << filename);
      return -1;
   }

   return 0;

}